

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffainit(fitsfile *fptr,int *status)

{
  long lVar1;
  LONGLONG *pLVar2;
  int iVar3;
  FITSfile *pFVar4;
  tcolumn *ptVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  char *pcVar13;
  LONGLONG rowlen;
  long tfield;
  LONGLONG nrows;
  LONGLONG pcount;
  char name [75];
  char message [81];
  char value [71];
  char comm [73];
  LONGLONG local_1a8;
  int local_1a0;
  undefined4 uStack_19c;
  long local_198;
  long local_190;
  uint local_188 [20];
  char local_138 [96];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  pFVar4 = fptr->Fptr;
  if (fptr->HDUposition != pFVar4->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar4 = fptr->Fptr;
  }
  pFVar4->hdutype = 1;
  pFVar4->headend = pFVar4->logfilesize;
  iVar3 = ffgttb(fptr,&local_1a8,&local_198,&local_190,(long *)&local_1a0,status);
  if (0 < iVar3) {
    return *status;
  }
  if (local_190 != 0) {
    ffxmsg(5,"PCOUNT keyword not equal to 0 in ASCII table (ffainit).");
    snprintf(local_138,0x51,"  PCOUNT = %ld",local_190);
    ffxmsg(5,local_138);
    *status = 0xd6;
    return 0xd6;
  }
  pFVar4 = fptr->Fptr;
  pFVar4->rowlength = local_1a8;
  pFVar4->tfield = local_1a0;
  if (pFVar4->tilerow != (int *)0x0) {
    uVar11 = (uint)((pFVar4->znaxis[0] + -1) / pFVar4->tilesize[0]);
    if (uVar11 < 0x7fffffff) {
      uVar9 = 0;
      do {
        pFVar4 = fptr->Fptr;
        if (pFVar4->tiledata[uVar9] != (void *)0x0) {
          free(pFVar4->tiledata[uVar9]);
          pFVar4 = fptr->Fptr;
        }
        if (pFVar4->tilenullarray[uVar9] != (void *)0x0) {
          free(pFVar4->tilenullarray[uVar9]);
        }
        uVar9 = uVar9 + 1;
      } while (uVar11 + 1 != uVar9);
      pFVar4 = fptr->Fptr;
    }
    free(pFVar4->tileanynull);
    free(fptr->Fptr->tiletype);
    free(fptr->Fptr->tiledatasize);
    free(fptr->Fptr->tilenullarray);
    free(fptr->Fptr->tiledata);
    free(fptr->Fptr->tilerow);
    pFVar4 = fptr->Fptr;
    pFVar4->tilenullarray = (void **)0x0;
    pFVar4->tileanynull = (int *)0x0;
    pFVar4->tiletype = (int *)0x0;
    pFVar4->tiledata = (void **)0x0;
    pFVar4->tilerow = (int *)0x0;
    pFVar4->tiledatasize = (long *)0x0;
  }
  if (pFVar4->tableptr != (tcolumn *)0x0) {
    free(pFVar4->tableptr);
  }
  sVar12 = CONCAT44(uStack_19c,local_1a0);
  if ((long)sVar12 < 1) {
    pFVar4 = fptr->Fptr;
    pFVar4->tableptr = (tcolumn *)0x0;
  }
  else {
    ptVar5 = (tcolumn *)calloc(sVar12,0xa0);
    if (ptVar5 == (tcolumn *)0x0) {
      ffxmsg(5,"malloc failed to get memory for FITS table descriptors (ffainit)");
      fptr->Fptr->tableptr = (tcolumn *)0x0;
      *status = 0x6f;
      return 0x6f;
    }
    pFVar4 = fptr->Fptr;
    pFVar4->tableptr = ptVar5;
    do {
      ptVar5->ttype[0] = '\0';
      ptVar5->tscale = 1.0;
      ptVar5->tzero = 0.0;
      ptVar5->strnull[0] = '\x01';
      ptVar5->tbcol = -1;
      ptVar5->tdatatype = -9999;
      ptVar5 = ptVar5 + 1;
      sVar12 = sVar12 - 1;
    } while (sVar12 != 0);
  }
  pFVar4->numrows = local_198;
  pFVar4->origrows = local_198;
  pFVar4->heapstart = local_198 * local_1a8;
  pFVar4->heapsize = 0;
  pFVar4->compressimg = 0;
  iVar3 = 8;
  iVar10 = 0;
  do {
    ffgkyn(fptr,iVar3,(char *)local_188,local_d8,local_88,status);
    iVar7 = *status;
    if (iVar7 == 0xcd) {
      sVar12 = strlen(local_d8);
      (local_d8 + sVar12)[0] = '\'';
      (local_d8 + sVar12)[1] = '\0';
LAB_0018086f:
      *status = 0;
      iVar7 = 0;
    }
    else {
      if (iVar7 == 0xcf) goto LAB_0018086f;
      if (iVar7 == 0x6b) {
        ffxmsg(5,"END keyword not found in ASCII table header (ffainit).");
        *status = 0xd2;
        return 0xd2;
      }
      if (0 < iVar7) {
        return iVar7;
      }
    }
    if ((char)local_188[0] == 'T') {
      ffgtbp(fptr,(char *)local_188,local_d8,status);
      uVar11 = local_188[0] & 0xff;
    }
    else {
      uVar11 = local_188[0];
      if ((char)local_188[0] == 'E' && local_188[0] == 0x444e45) {
        pFVar4 = fptr->Fptr;
        if (0 < CONCAT44(uStack_19c,local_1a0)) {
          pcVar13 = pFVar4->tableptr->tform;
          lVar6 = 0;
          do {
            iVar3 = (int)lVar6;
            if (*(int *)(pcVar13 + -0x3c) == -9999) {
              ffkeyn("TFORM",iVar3 + 1,(char *)local_188,status);
              snprintf(local_138,0x51,"Required %s keyword not found (ffainit).",local_188);
              ffxmsg(5,local_138);
              *status = 0xe8;
              return 0xe8;
            }
            lVar8 = *(long *)(pcVar13 + -0x44);
            if (lVar8 == -1) {
              ffkeyn("TBCOL",iVar3 + 1,(char *)local_188,status);
              snprintf(local_138,0x51,"Required %s keyword not found (ffainit).",local_188);
              ffxmsg(5,local_138);
              *status = 0xe7;
              return 0xe7;
            }
            lVar1 = pFVar4->rowlength;
            if (lVar1 != 0) {
              if ((lVar8 < 0) || (lVar1 <= lVar8)) {
                ffkeyn("TBCOL",iVar3 + 1,(char *)local_188,status);
                snprintf(local_138,0x51,"Value of %s keyword out of range: %ld (ffainit).",local_188
                         ,lVar8);
                ffxmsg(5,local_138);
                *status = 0xea;
                return 0xea;
              }
              if (lVar1 < lVar8 + *(long *)(pcVar13 + 0xc)) {
                snprintf(local_138,0x51,"Column %d is too wide to fit in table (ffainit)",
                         (ulong)(iVar3 + 1));
                ffxmsg(5,local_138);
                snprintf(local_138,0x51," TFORM = %s and NAXIS1 = %ld",pcVar13,fptr->Fptr->rowlength
                        );
                ffxmsg(5,local_138);
                *status = 0xec;
                return 0xec;
              }
            }
            lVar6 = lVar6 + 1;
            pcVar13 = pcVar13 + 0xa0;
          } while (CONCAT44(uStack_19c,local_1a0) != lVar6);
        }
        pLVar2 = pFVar4->headstart;
        pFVar4->headend = pFVar4->nextkey - (long)(iVar10 * 0x50 + 0x50);
        lVar8 = ((pFVar4->nextkey + -0x50) / 0xb40) * 0xb40;
        pFVar4->datastart = lVar8 + 0xb40;
        lVar6 = local_198 * local_1a8 + 0xb3f;
        iVar3 = pFVar4->curhdu;
        pLVar2[(long)iVar3 + 1] =
             ((lVar6 / 0xb40) * 0xb40 - lVar6) + local_198 * local_1a8 + lVar8 + 0x167f;
        pFVar4->nextkey = pLVar2[iVar3];
        return iVar7;
      }
    }
    iVar10 = iVar10 + 1;
    if (((char)uVar11 != '\0' || local_d8[0] != '\0') || local_88[0] != '\0') {
      iVar10 = 0;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int ffainit(fitsfile *fptr,      /* I - FITS file pointer */
            int *status)         /* IO - error status     */
{
/*
  initialize the parameters defining the structure of an ASCII table 
*/
    int  ii, nspace, ntilebins;
    long tfield;
    LONGLONG pcount, rowlen, nrows, tbcoln;
    tcolumn *colptr = 0;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char message[FLEN_ERRMSG], errmsg[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->hdutype = ASCII_TBL;  /* set that this is an ASCII table */
    (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize;  /* set max size */

    /* get table parameters and test that the header is a valid: */
    if (ffgttb(fptr, &rowlen, &nrows, &pcount, &tfield, status) > 0)  
       return(*status);

    if (pcount != 0)
    {
       ffpmsg("PCOUNT keyword not equal to 0 in ASCII table (ffainit).");
       snprintf(errmsg, FLEN_ERRMSG,"  PCOUNT = %ld", (long) pcount);
       ffpmsg(errmsg);
       return(*status = BAD_PCOUNT);
    }

    (fptr->Fptr)->rowlength = rowlen; /* store length of a row */
    (fptr->Fptr)->tfield = tfield; /* store number of table fields in row */

     /* free the tile-compressed image cache, if it exists */
     if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
     }

    if ((fptr->Fptr)->tableptr)
       free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

    /* mem for column structures ; space is initialized = 0 */
    if (tfield > 0)
    {
      colptr = (tcolumn *) calloc(tfield, sizeof(tcolumn) );
      if (!colptr)
      {
        ffpmsg
        ("malloc failed to get memory for FITS table descriptors (ffainit)");
        (fptr->Fptr)->tableptr = 0;  /* set a null table structure pointer */
        return(*status = ARRAY_TOO_BIG);
      }
    }

    /* copy the table structure address to the fitsfile structure */
    (fptr->Fptr)->tableptr = colptr; 

    /*  initialize the table field parameters */
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        colptr->ttype[0] = '\0';  /* null column name */
        colptr->tscale = 1.;
        colptr->tzero  = 0.;
        colptr->strnull[0] = ASCII_NULL_UNDEFINED;  /* null value undefined */
        colptr->tbcol = -1;          /* initialize to illegal value */
        colptr->tdatatype = -9999;   /* initialize to illegal value */
    }

    /*
      Initialize the fictitious heap starting address (immediately following
      the table data) and a zero length heap.  This is used to find the
      end of the table data when checking the fill values in the last block. 
      There is no special data following an ASCII table.
    */
    (fptr->Fptr)->numrows = nrows;
    (fptr->Fptr)->origrows = nrows;
    (fptr->Fptr)->heapstart = rowlen * nrows;
    (fptr->Fptr)->heapsize = 0;

    (fptr->Fptr)->compressimg = 0;  /* this is not a compressed image */

    /* now search for the table column keywords and the END keyword */

    for (nspace = 0, ii = 8; 1; ii++)  /* infinite loop  */
    {
        ffgkyn(fptr, ii, name, value, comm, status);

        /* try to ignore minor syntax errors */
        if (*status == NO_QUOTE)
        {
            strcat(value, "'");
            *status = 0;
        }
        else if (*status == BAD_KEYCHAR)
        {
            *status = 0;
        }

        if (*status == END_OF_FILE)
        {
            ffpmsg("END keyword not found in ASCII table header (ffainit).");
            return(*status = NO_END);
        }
        else if (*status > 0)
            return(*status);

        else if (name[0] == 'T')   /* keyword starts with 'T' ? */
            ffgtbp(fptr, name, value, status); /* test if column keyword */

        else if (!FSTRCMP(name, "END"))  /* is this the END keyword? */
            break;

        if (!name[0] && !value[0] && !comm[0])  /* a blank keyword? */
            nspace++;

        else
            nspace = 0;
    }

    /* test that all required keywords were found and have legal values */
    colptr = (fptr->Fptr)->tableptr;
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        tbcoln = colptr->tbcol;  /* the starting column number (zero based) */

        if (colptr->tdatatype == -9999)
        {
            ffkeyn("TFORM", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffainit).", name);
            ffpmsg(message);
            return(*status = NO_TFORM);
        }

        else if (tbcoln == -1)
        {
            ffkeyn("TBCOL", ii+1, name, status); /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffainit).", name);
            ffpmsg(message);
            return(*status = NO_TBCOL);
        }

        else if ((fptr->Fptr)->rowlength != 0 && 
                (tbcoln < 0 || tbcoln >= (fptr->Fptr)->rowlength ) )
        {
            ffkeyn("TBCOL", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Value of %s keyword out of range: %ld (ffainit).",
            name, (long) tbcoln);
            ffpmsg(message);
            return(*status = BAD_TBCOL);
        }

        else if ((fptr->Fptr)->rowlength != 0 && 
                 tbcoln + colptr->twidth > (fptr->Fptr)->rowlength )
        {
            snprintf(message,FLEN_ERRMSG,"Column %d is too wide to fit in table (ffainit)",
            ii+1);
            ffpmsg(message);
            snprintf(message, FLEN_ERRMSG," TFORM = %s and NAXIS1 = %ld",
                    colptr->tform, (long) (fptr->Fptr)->rowlength);
            ffpmsg(message);
            return(*status = COL_TOO_WIDE);
        }
    }

    /*
      now we know everything about the table; just fill in the parameters:
      the 'END' record is 80 bytes before the current position, minus
      any trailing blank keywords just before the END keyword.
    */
    (fptr->Fptr)->headend = (fptr->Fptr)->nextkey - (80 * (nspace + 1));
 
    /* the data unit begins at the beginning of the next logical block */
    (fptr->Fptr)->datastart = (((fptr->Fptr)->nextkey - 80) / 2880 + 1) 
                              * 2880;

    /* the next HDU begins in the next logical block after the data  */
    (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] =
         (fptr->Fptr)->datastart +
         ( ((LONGLONG)rowlen * nrows + 2879) / 2880 * 2880 );

    /* reset next keyword pointer to the start of the header */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu ];

    return(*status);
}